

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

MutableSubtree ts_subtree_make_mut(SubtreePool *pool,Subtree self)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  TSStateId TVar5;
  SubtreeHeapData *pSVar6;
  Subtree *__dest;
  long lVar7;
  SubtreeHeapData *pSVar8;
  MutableSubtree MVar9;
  long lVar10;
  uint extraout_EDX;
  uint uVar11;
  undefined4 uVar12;
  uint uVar13;
  ulong uVar14;
  ushort uVar15;
  undefined2 uVar16;
  Subtree SVar17;
  ulong *puVar18;
  ulong uVar19;
  char cVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  byte bVar31;
  int iStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_a4;
  anon_union_24_2_84168a9f_for_ExternalScannerState_0 local_50;
  undefined8 uStack_38;
  
  bVar31 = 0;
  if (((ulong)self.ptr & 1) != 0) {
    return (MutableSubtree)self.data;
  }
  if ((self.ptr)->ref_count == 1) {
    return (MutableSubtree)self.data;
  }
  pSVar6 = ts_subtree_pool_allocate(pool);
  SVar17 = self;
  pSVar8 = pSVar6;
  for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar4 = ((Length *)((long)SVar17 + 4))->bytes;
    pSVar8->ref_count = *(uint32_t *)SVar17;
    (pSVar8->padding).bytes = uVar4;
    SVar17.data = SVar17.data + (ulong)bVar31 * -0x10 + 8;
    pSVar8 = (SubtreeHeapData *)((long)pSVar8 + (ulong)bVar31 * -0x10 + 8);
  }
  uVar11 = pSVar6->child_count;
  if ((ulong)uVar11 == 0) {
    if ((pSVar6->field_0x2c & 0x40) != 0) {
      ts_external_scanner_state_copy
                ((ExternalScannerState *)&local_50,&((self.ptr)->field_17).external_scanner_state);
      *(undefined8 *)((long)&pSVar6->field_17 + 0x10) = local_50._16_8_;
      *(undefined8 *)((long)&pSVar6->field_17 + 0x18) = uStack_38;
      (pSVar6->field_17).field_0.children = (Subtree *)local_50.long_data;
      *(undefined8 *)((long)&pSVar6->field_17 + 8) = local_50._8_8_;
    }
LAB_0013224a:
    pSVar6->ref_count = 1;
    ts_subtree_release(pool,self);
    return (MutableSubtree)pSVar6;
  }
  uVar27 = (ulong)(self.ptr)->child_count;
  puVar18 = (ulong *)0x8;
  __dest = (Subtree *)calloc(uVar27,8);
  lVar10 = CONCAT71((int7)((ulong)lVar10 >> 8),__dest != (Subtree *)0x0 || uVar27 == 0);
  if (__dest != (Subtree *)0x0 || uVar27 == 0) {
    (pSVar6->field_17).field_0.children = __dest;
    memcpy(__dest,((self.ptr)->field_17).field_0.children,(ulong)uVar11 << 3);
    if (pSVar6->child_count != 0) {
      uVar27 = 0;
      do {
        ts_subtree_retain((pSVar6->field_17).field_0.children[uVar27]);
        uVar27 = uVar27 + 1;
      } while (uVar27 < pSVar6->child_count);
    }
    goto LAB_0013224a;
  }
  ts_subtree_make_mut_cold_1();
  if ((uVar27 & 1) != 0) {
    __assert_fail("!self.data.is_inline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                  ,0x15b,
                  "void ts_subtree_set_children(MutableSubtree, Subtree *, uint32_t, const TSLanguage *)"
                 );
  }
  if ((*(int *)(uVar27 + 0x24) != 0) && (*(ulong **)(uVar27 + 0x30) != puVar18)) {
    free(*(ulong **)(uVar27 + 0x30));
  }
  *(uint *)(uVar27 + 0x24) = extraout_EDX;
  *(ulong **)(uVar27 + 0x30) = puVar18;
  *(undefined8 *)(uVar27 + 0x38) = 0;
  uVar11 = 0;
  *(undefined4 *)(uVar27 + 0x20) = 0;
  *(undefined8 *)(uVar27 + 0x40) = 1;
  *(byte *)(uVar27 + 0x2c) = *(byte *)(uVar27 + 0x2c) & 0xbf;
  *(undefined4 *)(uVar27 + 0x48) = 0;
  TVar5 = TS_TREE_STATE_NONE;
  if ((ulong)*(ushort *)(uVar27 + 0x4c) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (ulong)*(ushort *)(lVar10 + 0x48) * (ulong)*(ushort *)(uVar27 + 0x4c) * 2 +
            *(long *)(lVar10 + 0x40);
  }
  if (extraout_EDX != 0) {
    uVar19 = 0;
    uVar25 = 0;
    uVar13 = 0;
    do {
      uVar2 = puVar18[uVar19];
      uVar11 = (uint)(uVar2 >> 0x10);
      uVar3 = (uint)(uVar2 >> 0x20);
      if (uVar19 == 0) {
        if ((uVar2 & 1) == 0) {
          uVar14 = *(ulong *)(uVar2 + 4) & 0xffffffff;
          uVar24 = *(ulong *)(uVar2 + 4) >> 0x20;
          uVar11 = *(uint *)(uVar2 + 0xc);
        }
        else {
          uVar14 = (ulong)(uVar11 & 0xff);
          uVar24 = (ulong)(uVar3 >> 8 & 0xf);
          uVar11 = uVar3 & 0xff;
        }
        *(ulong *)(uVar27 + 4) = uVar24 << 0x20 | uVar14;
        *(uint *)(uVar27 + 0xc) = uVar11;
        if ((uVar2 & 1) == 0) {
          uVar14 = *(ulong *)(uVar2 + 0x10);
          uVar24 = uVar14 & 0xffffffff00000000;
          uVar12 = *(undefined4 *)(uVar2 + 0x18);
        }
        else {
          uVar14 = uVar2 >> 0x18 & 0xff;
          uVar12 = (undefined4)uVar14;
          uVar24 = 0;
        }
        *(ulong *)(uVar27 + 0x10) = uVar14 & 0xffffffff | uVar24;
        *(undefined4 *)(uVar27 + 0x18) = uVar12;
      }
      else {
        if ((uVar2 & 1) == 0) {
          uVar11 = (uint)*(undefined8 *)(uVar2 + 4);
          uVar28 = (uint)((ulong)*(undefined8 *)(uVar2 + 4) >> 0x20);
          uVar26 = *(uint *)(uVar2 + 0xc);
        }
        else {
          uVar11 = uVar11 & 0xff;
          uVar28 = uVar3 >> 8 & 0xf;
          uVar26 = uVar3 & 0xff;
        }
        if ((uVar2 & 1) == 0) {
          uVar14 = *(ulong *)(uVar2 + 0x10);
          iVar23 = (int)(uVar14 >> 0x20);
          uVar29 = *(uint *)(uVar2 + 0x18);
        }
        else {
          uVar14 = uVar2 >> 0x18 & 0xff;
          uVar29 = (uint)uVar14;
          iVar23 = 0;
        }
        uVar22 = CONCAT44(uVar26,uVar28) + CONCAT44(uVar29,iVar23);
        uVar24 = uVar22 & 0xffffffff | (ulong)uVar29 << 0x20;
        if (iVar23 == 0) {
          uVar24 = uVar22;
        }
        iStack_c4 = (int)uVar24;
        uStack_a4 = (undefined4)((ulong)*(undefined8 *)(uVar27 + 0x10) >> 0x20);
        uVar22 = CONCAT44(*(undefined4 *)(uVar27 + 0x18),uStack_a4) + uVar24;
        uVar24 = uVar22 & 0xffffffff | uVar24 & 0xffffffff00000000;
        if (iStack_c4 == 0) {
          uVar24 = uVar22;
        }
        iStack_c4 = (int)uVar24;
        uStack_c0 = (undefined4)(uVar24 >> 0x20);
        *(ulong *)(uVar27 + 0x10) =
             CONCAT44(iStack_c4,(int)uVar14 + uVar11 + (int)*(undefined8 *)(uVar27 + 0x10));
        *(undefined4 *)(uVar27 + 0x18) = uStack_c0;
      }
      if ((uVar2 & 1) == 0) {
        uVar11 = *(uint *)(uVar2 + 0x1c);
      }
      else {
        uVar11 = uVar3 >> 0xc & 0xf;
      }
      uVar11 = *(int *)(uVar27 + 0x10) + *(int *)(uVar27 + 4) + uVar11;
      if (uVar11 <= uVar13) {
        uVar11 = uVar13;
      }
      if ((uVar2 & 1) == 0) {
        if (*(short *)(uVar2 + 0x28) != -2) {
          if ((uVar2 & 1) != 0) goto LAB_001324ec;
          uVar13 = *(uint *)(uVar2 + 0x2c) >> 7;
          goto LAB_001324f2;
        }
      }
      else {
LAB_001324ec:
        uVar13 = (uint)(uVar2 >> 5) & 0x7ffffff;
LAB_001324f2:
        uVar13 = uVar13 & 1;
        cVar20 = (char)uVar13;
        if (uVar13 != 0) {
          uVar13 = 0x262;
        }
        if (cVar20 == '\0' && (uVar2 & 1) == 0) {
          uVar13 = *(uint *)(uVar2 + 0x20);
        }
        *(int *)(uVar27 + 0x20) = *(int *)(uVar27 + 0x20) + uVar13;
      }
      iVar23 = 1;
      if ((uVar2 & 1) == 0) {
        if (*(int *)(uVar2 + 0x24) == 0) {
          iVar21 = 0;
        }
        else {
          iVar21 = *(int *)(uVar2 + 0x48);
        }
        *(int *)(uVar27 + 0x48) = *(int *)(uVar27 + 0x48) + iVar21;
        if (((uVar2 & 1) == 0) && (*(int *)(uVar2 + 0x24) != 0)) {
          iVar23 = *(int *)(uVar2 + 0x40);
        }
      }
      *(int *)(uVar27 + 0x40) = *(int *)(uVar27 + 0x40) + iVar23;
      if ((lVar7 == 0) || (*(short *)(lVar7 + uVar25 * 2) == 0)) {
LAB_00132593:
        if ((uVar2 & 1) == 0) {
          uVar13 = (uint)*(ushort *)(uVar2 + 0x2c);
        }
        else {
          uVar13 = (uint)(uVar2 >> 1) & 0x7fffffff;
        }
        if ((uVar13 & 1) != 0) {
          *(int *)(uVar27 + 0x38) = *(int *)(uVar27 + 0x38) + 1;
          if ((uVar2 & 1) == 0) {
            uVar13 = *(uint *)(uVar2 + 0x2c) >> 1;
          }
          else {
            uVar13 = (uint)(uVar2 >> 2) & 0x3fffffff;
          }
          iVar23 = 1;
          if ((uVar13 & 1) != 0) {
LAB_001325ed:
            *(int *)(uVar27 + 0x3c) = *(int *)(uVar27 + 0x3c) + iVar23;
          }
          goto LAB_001325f0;
        }
        if ((uVar2 & 1) == 0) {
          if (*(int *)(uVar2 + 0x24) != 0) {
            *(int *)(uVar27 + 0x38) = *(int *)(uVar27 + 0x38) + *(int *)(uVar2 + 0x38);
            iVar23 = *(int *)(uVar2 + 0x3c);
            goto LAB_001325ed;
          }
          goto LAB_001325f0;
        }
LAB_00132622:
        uVar13 = (uint)uVar2 >> 3;
      }
      else {
        if ((uVar2 & 1) == 0) {
          uVar13 = *(uint *)(uVar2 + 0x2c) >> 2;
        }
        else {
          uVar13 = (uint)(uVar2 >> 3) & 0x1fffffff;
        }
        if ((uVar13 & 1) != 0) goto LAB_00132593;
        *(int *)(uVar27 + 0x38) = *(int *)(uVar27 + 0x38) + 1;
        uVar1 = *(ushort *)(lVar7 + uVar25 * 2);
        if ((uVar1 != 0xfffe) &&
           ((iVar23 = 1, uVar1 == 0xffff ||
            ((*(byte *)(*(long *)(lVar10 + 0x20) + (ulong)uVar1) & 2) != 0)))) goto LAB_001325ed;
LAB_001325f0:
        if ((uVar2 & 1) != 0) goto LAB_00132622;
        if ((*(byte *)(uVar2 + 0x2c) & 0x40) != 0) {
          *(byte *)(uVar27 + 0x2c) = *(byte *)(uVar27 + 0x2c) | 0x40;
        }
        if ((uVar2 & 1) != 0) goto LAB_00132622;
        if (*(short *)(uVar2 + 0x28) == -1) {
          *(byte *)(uVar27 + 0x2c) = *(byte *)(uVar27 + 0x2c) | 0x18;
          *(TSStateId *)(uVar27 + 0x2a) = TVar5;
        }
        if ((uVar2 & 1) != 0) goto LAB_00132622;
        uVar13 = *(uint *)(uVar2 + 0x2c) >> 2;
      }
      uVar25 = (ulong)((int)uVar25 + (uint)((uVar13 & 1) == 0));
      uVar19 = uVar19 + 1;
      uVar13 = uVar11;
    } while (extraout_EDX != uVar19);
  }
  *(uint *)(uVar27 + 0x1c) = uVar11 - (*(int *)(uVar27 + 4) + *(int *)(uVar27 + 0x10));
  uVar1 = *(ushort *)(uVar27 + 0x28);
  pSVar8 = (SubtreeHeapData *)(ulong)uVar1;
  if (0xfffd < uVar1) {
    *(int *)(uVar27 + 0x20) =
         *(int *)(uVar27 + 0x10) + *(int *)(uVar27 + 0x14) * 0x1e + *(int *)(uVar27 + 0x20) + 500;
    if (extraout_EDX == 0) {
      return (MutableSubtree)pSVar8;
    }
    uVar19 = 0;
    do {
      uVar25 = puVar18[uVar19];
      bVar30 = true;
      if ((uVar25 & 1) == 0) {
        bVar30 = *(int *)(uVar25 + 0x24) == 0;
      }
      if ((uVar25 & 1) == 0) {
        uVar11 = *(uint *)(uVar25 + 0x2c) >> 2;
      }
      else {
        uVar11 = (uint)(uVar25 >> 3) & 0x1fffffff;
      }
      if ((uVar11 & 1) == 0) {
        if ((uVar25 & 1) == 0) {
          if ((bool)(*(short *)(uVar25 + 0x28) == -1 & bVar30)) goto LAB_0013273e;
          if ((uVar25 & 1) != 0) goto LAB_0013270b;
          uVar11 = (uint)*(ushort *)(uVar25 + 0x2c);
        }
        else {
LAB_0013270b:
          uVar11 = (uint)(uVar25 >> 1) & 0x7fffffff;
        }
        iVar23 = 100;
        if ((uVar11 & 1) == 0) {
          if (bVar30) goto LAB_0013273e;
          iVar23 = *(int *)(uVar25 + 0x38) * 100;
        }
        *(int *)(uVar27 + 0x20) = *(int *)(uVar27 + 0x20) + iVar23;
      }
LAB_0013273e:
      uVar19 = uVar19 + 1;
    } while (extraout_EDX != uVar19);
  }
  if (extraout_EDX == 0) {
    return (MutableSubtree)pSVar8;
  }
  uVar19 = *puVar18;
  bVar31 = (byte)(uVar19 >> 8);
  if ((uVar19 & 1) == 0) {
    if (*(int *)(uVar19 + 0x24) == 0) {
      uVar15 = *(ushort *)(uVar19 + 0x28);
    }
    else {
      uVar15 = *(ushort *)(uVar19 + 0x4e);
    }
  }
  else {
    uVar15 = (ushort)bVar31;
  }
  uVar25 = puVar18[extraout_EDX - 1];
  *(ushort *)(uVar27 + 0x4e) = uVar15;
  if ((uVar19 & 1) == 0) {
    if (*(int *)(uVar19 + 0x24) == 0) {
      uVar16 = *(undefined2 *)(uVar19 + 0x2a);
    }
    else {
      uVar16 = *(undefined2 *)(uVar19 + 0x50);
    }
  }
  else {
    uVar16 = (undefined2)(uVar19 >> 0x30);
  }
  *(undefined2 *)(uVar27 + 0x50) = uVar16;
  if (((uVar19 & 1) == 0) && ((*(byte *)(uVar19 + 0x2c) & 8) != 0)) {
    *(byte *)(uVar27 + 0x2c) = *(byte *)(uVar27 + 0x2c) | 8;
  }
  if (((uVar25 & 1) == 0) && ((*(byte *)(uVar25 + 0x2c) & 0x10) != 0)) {
    *(byte *)(uVar27 + 0x2c) = *(byte *)(uVar27 + 0x2c) | 0x10;
  }
  if (extraout_EDX == 1) {
    return (MutableSubtree)pSVar8;
  }
  if (((*(ushort *)(uVar27 + 0x2c) >> 1 | *(ushort *)(uVar27 + 0x2c)) & 1) != 0) {
    return (MutableSubtree)pSVar8;
  }
  if ((uVar19 & 1) == 0) {
    uVar15 = *(ushort *)(uVar19 + 0x28);
  }
  else {
    uVar15 = (ushort)bVar31;
  }
  if (uVar15 != uVar1) {
    return (MutableSubtree)pSVar8;
  }
  uVar11 = 0;
  if (((uVar19 & 1) == 0) && (*(int *)(uVar19 + 0x24) != 0)) {
    uVar11 = *(uint *)(uVar19 + 0x44);
  }
  uVar13 = 0;
  if (((uVar25 & 1) == 0) && (uVar13 = 0, *(int *)(uVar25 + 0x24) != 0)) {
    uVar13 = *(uint *)(uVar25 + 0x44);
  }
  if (uVar13 < uVar11) {
    MVar9 = (MutableSubtree)0x1;
    if ((uVar19 & 1) != 0) goto LAB_00132841;
    iVar23 = *(int *)(uVar19 + 0x24);
  }
  else {
    MVar9 = (MutableSubtree)0x1;
    if ((uVar25 & 1) != 0) goto LAB_00132841;
    iVar23 = *(int *)(uVar25 + 0x24);
    uVar19 = uVar25;
  }
  MVar9 = (MutableSubtree)0x1;
  if (iVar23 != 0) {
    MVar9._0_4_ = *(int *)(uVar19 + 0x44) + 1;
    MVar9._4_4_ = 0;
  }
LAB_00132841:
  *(int *)(uVar27 + 0x44) = MVar9._0_4_;
  return (MutableSubtree)MVar9.ptr;
}

Assistant:

MutableSubtree ts_subtree_make_mut(SubtreePool *pool, Subtree self) {
  if (self.data.is_inline) return (MutableSubtree) {self.data};
  if (self.ptr->ref_count == 1) return ts_subtree_to_mut_unsafe(self);

  SubtreeHeapData *result = ts_subtree_pool_allocate(pool);
  memcpy(result, self.ptr, sizeof(SubtreeHeapData));
  if (result->child_count > 0) {
    result->children = ts_calloc(self.ptr->child_count, sizeof(Subtree));
    memcpy(result->children, self.ptr->children, result->child_count * sizeof(Subtree));
    for (uint32_t i = 0; i < result->child_count; i++) {
      ts_subtree_retain(result->children[i]);
    }
  } else if (result->has_external_tokens) {
    result->external_scanner_state = ts_external_scanner_state_copy(&self.ptr->external_scanner_state);
  }
  result->ref_count = 1;
  ts_subtree_release(pool, self);
  return (MutableSubtree) {.ptr = result};
}